

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SSLVersionTest_WriteAfterReadSentFatalAlert_Test::TestBody
          (SSLVersionTest_WriteAfterReadSentFatalAlert_Test *this)

{
  bool bVar1;
  char *pcVar2;
  SSL *pSVar3;
  BIO *pBVar4;
  BIO_METHOD *type;
  pointer pbVar5;
  char *in_R9;
  BIO *local_468;
  SSL *local_460;
  char *local_458;
  AssertHelper local_430;
  Message local_428;
  uint local_41c;
  undefined1 local_418 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_3e8;
  Message local_3e0;
  int local_3d4;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar__4;
  Message local_3b8;
  int local_3b0 [2];
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_378;
  Message local_370;
  int local_364;
  undefined1 local_360 [8];
  AssertionResult gtest_ar__3;
  Message local_348;
  uint local_33c;
  undefined1 local_338 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_308;
  Message local_300;
  int local_2f4;
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar__2;
  size_t len;
  uint8_t *unused;
  Message local_2c8;
  int local_2c0 [2];
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_1;
  char buf [256];
  AssertHelper local_1a0;
  Message local_198;
  int local_190 [2];
  undefined1 local_188 [8];
  AssertionResult gtest_ar;
  string local_170;
  AssertHelper local_150;
  Message local_148;
  undefined1 local_140 [8];
  AssertionResult gtest_ar__1;
  UniquePtr<BIO> mem;
  BIO *other_wbio;
  SSL *ssl;
  ScopedTrace gtest_trace_3166;
  const_iterator pbStack_110;
  bool test_server;
  const_iterator __end2;
  const_iterator __begin2;
  initializer_list<bool> local_f8;
  initializer_list<bool> *local_e8;
  initializer_list<bool> *__range2;
  UniquePtr<BIO> server_wbio;
  UniquePtr<BIO> client_wbio;
  string local_c8;
  AssertHelper local_a8;
  Message local_a0 [3];
  ClientConfig local_88;
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  SSLVersionTest_WriteAfterReadSentFatalAlert_Test *this_local;
  
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  bVar1 = SSLVersionTest::is_dtls(&this->super_SSLVersionTest);
  if (!bVar1) {
    local_88.verify_hostname.field_2._M_allocated_capacity = 0;
    local_88.verify_hostname.field_2._8_8_ = 0;
    local_88.verify_hostname._M_dataplus = (_Alloc_hider)0x0;
    local_88.verify_hostname._1_7_ = 0;
    local_88.verify_hostname._M_string_length = 0;
    local_88.servername.field_2._M_allocated_capacity = 0;
    local_88.servername.field_2._8_8_ = 0;
    local_88.servername._M_dataplus = (_Alloc_hider)0x0;
    local_88.servername._1_7_ = 0;
    local_88.servername._M_string_length = 0;
    local_88.session = (SSL_SESSION *)0x0;
    local_88.ca_names = (stack_st_CRYPTO_BUFFER *)0x0;
    local_88.hostflags = 0;
    local_88.early_data = false;
    local_88._85_3_ = 0;
    ClientConfig::ClientConfig(&local_88);
    local_21 = SSLVersionTest::Connect(&this->super_SSLVersionTest,&local_88);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_20,&local_21,(type *)0x0);
    ClientConfig::~ClientConfig(&local_88);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
    if (!bVar1) {
      testing::Message::Message(local_a0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_c8,(internal *)local_20,(AssertionResult *)"Connect()","false","true",in_R9)
      ;
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0xc57,pcVar2);
      testing::internal::AssertHelper::operator=(&local_a8,local_a0);
      testing::internal::AssertHelper::~AssertHelper(&local_a8);
      std::__cxx11::string::~string((string *)&local_c8);
      testing::Message::~Message(local_a0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
    if (bVar1) {
      pSVar3 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                (&(this->super_SSLVersionTest).client_);
      pBVar4 = SSL_get_wbio(pSVar3);
      UpRef((bssl *)&server_wbio,(BIO *)pBVar4);
      pSVar3 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                (&(this->super_SSLVersionTest).server_);
      pBVar4 = SSL_get_wbio(pSVar3);
      UpRef((bssl *)&__range2,(BIO *)pBVar4);
      __begin2._6_1_ = 0;
      __begin2._7_1_ = 1;
      local_f8._M_array = (iterator)((long)&__begin2 + 6);
      local_f8._M_len = 2;
      local_e8 = &local_f8;
      __end2 = std::initializer_list<bool>::begin(local_e8);
      pbStack_110 = std::initializer_list<bool>::end(local_e8);
      for (; __end2 != pbStack_110; __end2 = __end2 + 1) {
        ssl._7_1_ = *__end2 & 1;
        if (ssl._7_1_ == 0) {
          local_458 = "client";
        }
        else {
          local_458 = "server";
        }
        testing::ScopedTrace::ScopedTrace
                  ((ScopedTrace *)((long)&ssl + 6),
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0xc5e,local_458);
        if ((ssl._7_1_ & 1) == 0) {
          local_460 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                       (&(this->super_SSLVersionTest).client_);
        }
        else {
          local_460 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                       (&(this->super_SSLVersionTest).server_);
        }
        if ((ssl._7_1_ & 1) == 0) {
          local_468 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                                       ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&__range2);
        }
        else {
          local_468 = (BIO *)std::unique_ptr<bio_st,_bssl::internal::Deleter>::get(&server_wbio);
        }
        type = BIO_s_mem();
        pBVar4 = BIO_new(type);
        std::unique_ptr<bio_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
                  ((unique_ptr<bio_st,bssl::internal::Deleter> *)&gtest_ar__1.message_,
                   (pointer)pBVar4);
        testing::AssertionResult::AssertionResult<std::unique_ptr<bio_st,bssl::internal::Deleter>>
                  ((AssertionResult *)local_140,
                   (unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_,(type *)0x0)
        ;
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_140);
        if (!bVar1) {
          testing::Message::Message(&local_148);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_170,(internal *)local_140,(AssertionResult *)"mem","false","true",in_R9)
          ;
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0xc63,pcVar2);
          testing::internal::AssertHelper::operator=(&local_150,&local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          std::__cxx11::string::~string((string *)&local_170);
          testing::Message::~Message(&local_148);
        }
        bVar1 = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_140);
        if (!bVar1) {
          UpRef((bssl *)&gtest_ar.message_,(UniquePtr<BIO> *)&gtest_ar__1.message_);
          pbVar5 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::release
                             ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar.message_);
          SSL_set0_wbio((SSL *)local_460,pbVar5);
          std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar.message_);
          local_190[1] = 0xf;
          local_190[0] = BIO_write(local_468,"invalid record",0xf);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_188,"int{sizeof(kInvalidRecord)}",
                     "BIO_write(other_wbio, kInvalidRecord, sizeof(kInvalidRecord))",local_190 + 1,
                     local_190);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
          if (!bVar1) {
            testing::Message::Message(&local_198);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
            testing::internal::AssertHelper::AssertHelper
                      (&local_1a0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xc69,pcVar2);
            testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
            testing::internal::AssertHelper::~AssertHelper(&local_1a0);
            testing::Message::~Message(&local_198);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
          local_2c0[1] = 0xffffffff;
          local_2c0[0] = SSL_read(local_460,&gtest_ar_1.message_,0x100);
          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                    ((EqHelper *)local_2b8,"-1","SSL_read(ssl, buf, sizeof(buf))",local_2c0 + 1,
                     local_2c0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
          if (!bVar1) {
            testing::Message::Message(&local_2c8);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&unused,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xc6b,pcVar2);
            testing::internal::AssertHelper::operator=((AssertHelper *)&unused,&local_2c8);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&unused);
            testing::Message::~Message(&local_2c8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
          pbVar5 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                             ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
          local_2f4 = BIO_mem_contents(pbVar5,(uint8_t **)&len,(size_t *)&gtest_ar__2.message_);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_2f0,&local_2f4,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2f0);
          if (!bVar1) {
            testing::Message::Message(&local_300);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_2.message_,(internal *)local_2f0,
                       (AssertionResult *)"BIO_mem_contents(mem.get(), &unused, &len)","false",
                       "true",in_R9);
            pcVar2 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_308,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0xc70,pcVar2);
            testing::internal::AssertHelper::operator=(&local_308,&local_300);
            testing::internal::AssertHelper::~AssertHelper(&local_308);
            std::__cxx11::string::~string((string *)&gtest_ar_2.message_);
            testing::Message::~Message(&local_300);
          }
          bVar1 = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
          if (!bVar1) {
            local_33c = 0;
            testing::internal::CmpHelperNE<unsigned_int,unsigned_long>
                      ((internal *)local_338,"0u","len",&local_33c,
                       (unsigned_long *)&gtest_ar__2.message_);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_338);
            if (!bVar1) {
              testing::Message::Message(&local_348);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_338);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xc71,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__3.message_,&local_348);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
              testing::Message::~Message(&local_348);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_338);
            pbVar5 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_
                               );
            local_364 = BIO_reset(pbVar5);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_360,&local_364,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_360);
            if (!bVar1) {
              testing::Message::Message(&local_370);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_3.message_,(internal *)local_360,
                         (AssertionResult *)"BIO_reset(mem.get())","false","true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_378,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xc72,pcVar2);
              testing::internal::AssertHelper::operator=(&local_378,&local_370);
              testing::internal::AssertHelper::~AssertHelper(&local_378);
              std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
              testing::Message::~Message(&local_370);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
            local_3b0[1] = 0xffffffff;
            local_3b0[0] = SSL_write(local_460,"a",1);
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_3a8,"-1","SSL_write(ssl, \"a\", 1)",local_3b0 + 1,local_3b0
                      );
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3a8);
            if (!bVar1) {
              testing::Message::Message(&local_3b8);
              pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3a8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__4.message_,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xc75,pcVar2);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__4.message_,&local_3b8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__4.message_);
              testing::Message::~Message(&local_3b8);
            }
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
            pbVar5 = std::unique_ptr<bio_st,_bssl::internal::Deleter>::get
                               ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_
                               );
            local_3d4 = BIO_mem_contents(pbVar5,(uint8_t **)&len,(size_t *)&gtest_ar__2.message_);
            testing::AssertionResult::AssertionResult<int>
                      ((AssertionResult *)local_3d0,&local_3d4,(type *)0x0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
            if (!bVar1) {
              testing::Message::Message(&local_3e0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)&gtest_ar_4.message_,(internal *)local_3d0,
                         (AssertionResult *)"BIO_mem_contents(mem.get(), &unused, &len)","false",
                         "true",in_R9);
              pcVar2 = (char *)std::__cxx11::string::c_str();
              testing::internal::AssertHelper::AssertHelper
                        (&local_3e8,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0xc78,pcVar2);
              testing::internal::AssertHelper::operator=(&local_3e8,&local_3e0);
              testing::internal::AssertHelper::~AssertHelper(&local_3e8);
              std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
              testing::Message::~Message(&local_3e0);
            }
            bVar1 = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
            if (!bVar1) {
              local_41c = 0;
              testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
                        ((EqHelper *)local_418,"0u","len",&local_41c,
                         (unsigned_long *)&gtest_ar__2.message_);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_418);
              if (!bVar1) {
                testing::Message::Message(&local_428);
                pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_418);
                testing::internal::AssertHelper::AssertHelper
                          (&local_430,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0xc79,pcVar2);
                testing::internal::AssertHelper::operator=(&local_430,&local_428);
                testing::internal::AssertHelper::~AssertHelper(&local_430);
                testing::Message::~Message(&local_428);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_418);
              bVar1 = false;
            }
          }
        }
        std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                  ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&gtest_ar__1.message_);
        testing::ScopedTrace::~ScopedTrace((ScopedTrace *)((long)&ssl + 6));
        if (bVar1) break;
      }
      std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<bio_st,_bssl::internal::Deleter> *)&__range2);
      std::unique_ptr<bio_st,_bssl::internal::Deleter>::~unique_ptr(&server_wbio);
    }
  }
  return;
}

Assistant:

TEST_P(SSLVersionTest, WriteAfterReadSentFatalAlert) {
  // Decryption failures are not fatal in DTLS.
  if (is_dtls()) {
    return;
  }

  ASSERT_TRUE(Connect());

  // Save the write |BIO|s as the test will overwrite them.
  bssl::UniquePtr<BIO> client_wbio = bssl::UpRef(SSL_get_wbio(client_.get()));
  bssl::UniquePtr<BIO> server_wbio = bssl::UpRef(SSL_get_wbio(server_.get()));

  for (bool test_server : {false, true}) {
    SCOPED_TRACE(test_server ? "server" : "client");
    SSL *ssl = test_server ? server_.get() : client_.get();
    BIO *other_wbio = test_server ? client_wbio.get() : server_wbio.get();

    bssl::UniquePtr<BIO> mem(BIO_new(BIO_s_mem()));
    ASSERT_TRUE(mem);
    SSL_set0_wbio(ssl, bssl::UpRef(mem).release());

    // Read an invalid record from the peer.
    static const uint8_t kInvalidRecord[] = "invalid record";
    EXPECT_EQ(int{sizeof(kInvalidRecord)},
              BIO_write(other_wbio, kInvalidRecord, sizeof(kInvalidRecord)));
    char buf[256];
    EXPECT_EQ(-1, SSL_read(ssl, buf, sizeof(buf)));

    // |ssl| should have written an alert to the transport.
    const uint8_t *unused;
    size_t len;
    ASSERT_TRUE(BIO_mem_contents(mem.get(), &unused, &len));
    EXPECT_NE(0u, len);
    EXPECT_TRUE(BIO_reset(mem.get()));

    // Writing should fail.
    EXPECT_EQ(-1, SSL_write(ssl, "a", 1));

    // Nothing should be written to the transport.
    ASSERT_TRUE(BIO_mem_contents(mem.get(), &unused, &len));
    EXPECT_EQ(0u, len);
  }
}